

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_decompressSequencesLong_default
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  BYTE *base;
  BYTE *vBase;
  BYTE *dictEnd_00;
  ulong uVar1;
  seq_t sequence_00;
  seq_t sequence_01;
  BYTE *pBVar2;
  BYTE *pBVar3;
  uint uVar4;
  BIT_DStream_status BVar5;
  BYTE *litLimit;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  BIT_DStream_t *pBVar10;
  char **ppcVar11;
  char *local_5c0;
  size_t local_5b8;
  size_t local_5a8;
  long local_598;
  U32 local_57c;
  char *local_570;
  size_t local_568;
  size_t local_558;
  long local_548;
  U32 local_530;
  int local_518;
  int nbSeq_local;
  size_t seqSize_local;
  void *seqStart_local;
  size_t maxDstSize_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  size_t lastLLSize;
  U32 i_3;
  size_t oneSeqSize_1;
  size_t oneSeqSize;
  seq_t sequence;
  seq_t seq;
  size_t errcod;
  int i;
  int seqNb;
  seqState_t seqState;
  int seqAdvance;
  seq_t sequences [4];
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *prefixStart;
  BYTE *litEnd;
  BYTE *litPtr;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *iend;
  BYTE *ip;
  size_t local_308;
  void *local_300;
  size_t local_2f8;
  void *local_2f0;
  ZSTD_DCtx *local_2e8;
  BYTE *local_2e0;
  char *local_2d8;
  BYTE *matchBase;
  size_t pos;
  size_t temp;
  BYTE *pBStack_2b8;
  U32 extraBits;
  size_t offset;
  U32 ofBase;
  U32 mlBase;
  U32 llBase;
  U32 totalBits;
  U32 ofBits;
  U32 mlBits;
  U32 llBits;
  char *local_288;
  BYTE *matchBase_1;
  size_t pos_1;
  size_t temp_1;
  BYTE *pBStack_268;
  U32 extraBits_1;
  size_t offset_1;
  U32 ofBase_1;
  U32 mlBase_1;
  U32 llBase_1;
  U32 totalBits_1;
  U32 ofBits_1;
  U32 mlBits_1;
  U32 llBits_1;
  ulong local_238;
  ulong local_230;
  size_t local_228;
  BYTE *local_220;
  int local_218;
  uint local_214;
  int sub2;
  U32 i_1;
  size_t length1;
  BYTE *match;
  BYTE *iLitEnd;
  BYTE *oend_w;
  BYTE *oMatchEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  BYTE *local_1d0;
  BYTE *local_1c8;
  BYTE *local_1c0;
  BYTE **local_1b8;
  BYTE *local_1b0;
  BYTE *local_1a8;
  BYTE *local_1a0;
  ulong local_198;
  ulong local_190;
  size_t local_188;
  BYTE *local_180;
  int local_178;
  uint local_174;
  int sub2_1;
  U32 i_2;
  size_t length1_1;
  BYTE *match_1;
  BYTE *iLitEnd_1;
  BYTE *oend_w_1;
  BYTE *oMatchEnd_1;
  size_t sequenceLength_1;
  BYTE *oLitEnd_1;
  BYTE *local_130;
  BYTE *local_128;
  BYTE *local_120;
  BYTE **local_118;
  BYTE *local_110;
  BYTE *local_108;
  BYTE *local_100;
  size_t local_f8;
  size_t lowBits_5;
  ulong uStack_e8;
  U32 nbBits_5;
  ZSTD_seqSymbol DInfo_5;
  size_t lowBits_4;
  byte bStack_bd;
  U32 nbBits_4;
  ZSTD_seqSymbol DInfo_4;
  size_t lowBits_3;
  byte bStack_95;
  U32 nbBits_3;
  ZSTD_seqSymbol DInfo_3;
  size_t lowBits_2;
  byte bStack_6d;
  U32 nbBits_2;
  ZSTD_seqSymbol DInfo_2;
  size_t lowBits_1;
  byte bStack_45;
  U32 nbBits_1;
  ZSTD_seqSymbol DInfo_1;
  size_t lowBits;
  byte bStack_1d;
  U32 nbBits;
  ZSTD_seqSymbol DInfo;
  
  ip._0_4_ = isLongOffset;
  ostart = (BYTE *)((long)seqStart + seqSize);
  op = (BYTE *)((long)dst + maxDstSize);
  litEnd = dctx->litPtr;
  litLimit = litEnd + dctx->litSize;
  base = (BYTE *)dctx->prefixStart;
  vBase = (BYTE *)dctx->virtualStart;
  dictEnd_00 = (BYTE *)dctx->dictEnd;
  litPtr = (BYTE *)dst;
  oend = (BYTE *)dst;
  iend = (BYTE *)seqStart;
  ip._4_4_ = nbSeq;
  local_308 = seqSize;
  local_300 = seqStart;
  local_2f8 = maxDstSize;
  local_2f0 = dst;
  local_2e8 = dctx;
  if (nbSeq != 0) {
    local_518 = nbSeq;
    if (3 < nbSeq) {
      local_518 = 4;
    }
    seqState.pos._4_4_ = local_518;
    dctx->fseEntropy = 1;
    for (errcod._0_4_ = 0; (int)errcod < 3; errcod._0_4_ = (int)errcod + 1) {
      seqState.prevOffset[(long)(int)errcod + -1] = (ulong)(dctx->entropy).rep[(int)errcod];
    }
    seqState.dictEnd = (BYTE *)((long)dst - (long)base);
    seqState.prevOffset[2] = (size_t)base;
    seqState.prefixStart = dictEnd_00;
    sVar6 = BIT_initDStream((BIT_DStream_t *)&i,seqStart,(long)ostart - (long)seqStart);
    uVar4 = ERR_isError(sVar6);
    if (uVar4 != 0) {
      return 0xffffffffffffffec;
    }
    ZSTD_initFseState((ZSTD_fseState *)&seqState.DStream.limitPtr,(BIT_DStream_t *)&i,
                      local_2e8->LLTptr);
    ZSTD_initFseState((ZSTD_fseState *)&seqState.stateLL.table,(BIT_DStream_t *)&i,local_2e8->OFTptr
                     );
    ZSTD_initFseState((ZSTD_fseState *)&seqState.stateOffb.table,(BIT_DStream_t *)&i,
                      local_2e8->MLTptr);
    for (errcod._4_4_ = 0; BVar5 = BIT_reloadDStream((BIT_DStream_t *)&i),
        BVar5 < BIT_DStream_overflow && (int)errcod._4_4_ < seqState.pos._4_4_;
        errcod._4_4_ = errcod._4_4_ + 1) {
      lVar8 = (long)(int)errcod._4_4_;
      _llBits = (BIT_DStream_t *)&i;
      mlBits = (ZSTD_longOffset_e)ip;
      ofBits = (U32)*(byte *)(seqState.stateLL.state + 2 + (long)seqState.DStream.limitPtr * 8);
      totalBits = (U32)*(byte *)(seqState.stateML.state + 2 + (long)seqState.stateOffb.table * 8);
      llBase = (U32)*(byte *)(seqState.stateOffb.state + 2 + (long)seqState.stateLL.table * 8);
      mlBase = ofBits + totalBits + llBase;
      ofBase = *(U32 *)(seqState.stateLL.state + 4 + (long)seqState.DStream.limitPtr * 8);
      offset._4_4_ = *(uint *)(seqState.stateML.state + 4 + (long)seqState.stateOffb.table * 8);
      offset._0_4_ = *(uint *)(seqState.stateOffb.state + 4 + (long)seqState.stateLL.table * 8);
      if (llBase == 0) {
        pBStack_2b8 = (BYTE *)0x0;
      }
      else {
        uVar4 = MEM_32bits();
        if ((uVar4 == 0) || (mlBits == 0)) {
          uVar9 = (ulong)(uint)offset;
          sVar6 = BIT_readBitsFast(_llBits,llBase);
          pBStack_2b8 = (BYTE *)(uVar9 + sVar6);
          uVar4 = MEM_32bits();
          if (uVar4 != 0) {
            BIT_reloadDStream(_llBits);
          }
        }
        else {
          if (llBase < 0x18) {
            local_530 = llBase;
          }
          else {
            local_530 = 0x18;
          }
          temp._4_4_ = llBase - local_530;
          uVar9 = (ulong)(uint)offset;
          sVar6 = BIT_readBitsFast(_llBits,llBase - temp._4_4_);
          pBStack_2b8 = (BYTE *)(uVar9 + (sVar6 << ((byte)temp._4_4_ & 0x3f)));
          uVar4 = MEM_32bits();
          if ((uVar4 != 0) || (temp._4_4_ != 0)) {
            BIT_reloadDStream(_llBits);
          }
          if (temp._4_4_ != 0) {
            sVar6 = BIT_readBitsFast(_llBits,temp._4_4_);
            pBStack_2b8 = pBStack_2b8 + sVar6;
          }
        }
      }
      if (llBase < 2) {
        pBStack_2b8 = pBStack_2b8 + (int)(uint)(ofBase == 0);
        if (pBStack_2b8 == (BYTE *)0x0) {
          pBStack_2b8 = *(BYTE **)&_llBits[2].bitsConsumed;
        }
        else {
          if (pBStack_2b8 == (BYTE *)0x3) {
            local_548 = *(long *)&_llBits[2].bitsConsumed + -1;
          }
          else {
            local_548 = *(long *)(&_llBits[2].bitsConsumed + (long)pBStack_2b8 * 2);
          }
          pos = (int)(uint)((local_548 != 0 ^ 0xffU) & 1) + local_548;
          if (pBStack_2b8 != (BYTE *)0x1) {
            _llBits[2].start = _llBits[2].ptr;
          }
          _llBits[2].ptr = *(char **)&_llBits[2].bitsConsumed;
          pBStack_2b8 = (BYTE *)pos;
          *(size_t *)&_llBits[2].bitsConsumed = pos;
        }
      }
      else {
        _llBits[2].start = _llBits[2].ptr;
        _llBits[2].ptr = *(char **)&_llBits[2].bitsConsumed;
        *(BYTE **)&_llBits[2].bitsConsumed = pBStack_2b8;
      }
      pBVar2 = pBStack_2b8;
      uVar9 = (ulong)offset._4_4_;
      if (totalBits == 0) {
        local_558 = 0;
      }
      else {
        local_558 = BIT_readBitsFast(_llBits,totalBits);
      }
      uVar4 = MEM_32bits();
      if ((uVar4 != 0) && (0x13 < totalBits + ofBits)) {
        BIT_reloadDStream(_llBits);
      }
      uVar4 = MEM_64bits();
      if ((uVar4 != 0) && (0x1e < mlBase)) {
        BIT_reloadDStream(_llBits);
      }
      uVar7 = (ulong)ofBase;
      if (ofBits == 0) {
        local_568 = 0;
      }
      else {
        local_568 = BIT_readBitsFast(_llBits,ofBits);
      }
      uVar4 = MEM_32bits();
      if (uVar4 != 0) {
        BIT_reloadDStream(_llBits);
      }
      matchBase = (BYTE *)(*(long *)&_llBits[3].bitsConsumed + uVar7 + local_568);
      if (matchBase < pBVar2) {
        local_570 = (char *)_llBits[3].bitContainer;
      }
      else {
        local_570 = _llBits[2].limitPtr;
      }
      local_2d8 = local_570;
      local_570 = local_570 + (long)matchBase;
      *(BYTE **)&_llBits[3].bitsConsumed = matchBase + uVar9 + local_558;
      pBVar10 = _llBits + 1;
      uVar1 = *(ulong *)(*(long *)&_llBits[1].bitsConsumed + pBVar10->bitContainer * 8);
      bStack_1d = (byte)(uVar1 >> 0x18);
      sVar6 = BIT_readBits(_llBits,(uint)bStack_1d);
      pBVar10->bitContainer = (uVar1 & 0xffff) + sVar6;
      pBVar10 = _llBits + 1;
      uVar1 = *(ulong *)(_llBits[2].bitContainer + (long)pBVar10->limitPtr * 8);
      bStack_45 = (byte)(uVar1 >> 0x18);
      sVar6 = BIT_readBits(_llBits,(uint)bStack_45);
      pBVar10->limitPtr = (char *)((uVar1 & 0xffff) + sVar6);
      uVar4 = MEM_32bits();
      if (uVar4 != 0) {
        BIT_reloadDStream(_llBits);
      }
      pBVar10 = _llBits + 1;
      uVar1 = *(ulong *)(_llBits[1].start + (long)pBVar10->ptr * 8);
      bStack_6d = (byte)(uVar1 >> 0x18);
      sVar6 = BIT_readBits(_llBits,(uint)bStack_6d);
      pBVar10->ptr = (char *)((uVar1 & 0xffff) + sVar6);
      *(ulong *)(&stack0xfffffffffffffc18 + lVar8 * 0x20) = uVar7 + local_568;
      sequences[lVar8].litLength = uVar9 + local_558;
      sequences[lVar8].matchLength = (size_t)pBVar2;
      sequences[lVar8].offset = (long)local_570 - (long)pBVar2;
    }
    if ((int)errcod._4_4_ < seqState.pos._4_4_) {
      return 0xffffffffffffffec;
    }
    for (; BVar5 = BIT_reloadDStream((BIT_DStream_t *)&i),
        BVar5 < BIT_DStream_overflow && (int)errcod._4_4_ < ip._4_4_;
        errcod._4_4_ = errcod._4_4_ + 1) {
      _llBits_1 = (ZSTD_seqSymbol)&i;
      mlBits_1 = (ZSTD_longOffset_e)ip;
      ofBits_1 = (U32)*(byte *)(seqState.stateLL.state + 2 + (long)seqState.DStream.limitPtr * 8);
      totalBits_1 = (U32)*(byte *)(seqState.stateML.state + 2 + (long)seqState.stateOffb.table * 8);
      llBase_1 = (U32)*(byte *)(seqState.stateOffb.state + 2 + (long)seqState.stateLL.table * 8);
      mlBase_1 = ofBits_1 + totalBits_1 + llBase_1;
      ofBase_1 = *(U32 *)(seqState.stateLL.state + 4 + (long)seqState.DStream.limitPtr * 8);
      offset_1._4_4_ = *(uint *)(seqState.stateML.state + 4 + (long)seqState.stateOffb.table * 8);
      offset_1._0_4_ = *(uint *)(seqState.stateOffb.state + 4 + (long)seqState.stateLL.table * 8);
      if (llBase_1 == 0) {
        pBStack_268 = (BYTE *)0x0;
      }
      else {
        uVar4 = MEM_32bits();
        if ((uVar4 == 0) || (mlBits_1 == 0)) {
          uVar9 = (ulong)(uint)offset_1;
          sVar6 = BIT_readBitsFast((BIT_DStream_t *)_llBits_1,llBase_1);
          pBStack_268 = (BYTE *)(uVar9 + sVar6);
          uVar4 = MEM_32bits();
          if (uVar4 != 0) {
            BIT_reloadDStream((BIT_DStream_t *)_llBits_1);
          }
        }
        else {
          if (llBase_1 < 0x18) {
            local_57c = llBase_1;
          }
          else {
            local_57c = 0x18;
          }
          temp_1._4_4_ = llBase_1 - local_57c;
          uVar9 = (ulong)(uint)offset_1;
          sVar6 = BIT_readBitsFast((BIT_DStream_t *)_llBits_1,llBase_1 - temp_1._4_4_);
          pBStack_268 = (BYTE *)(uVar9 + (sVar6 << ((byte)temp_1._4_4_ & 0x3f)));
          uVar4 = MEM_32bits();
          if ((uVar4 != 0) || (temp_1._4_4_ != 0)) {
            BIT_reloadDStream((BIT_DStream_t *)_llBits_1);
          }
          if (temp_1._4_4_ != 0) {
            sVar6 = BIT_readBitsFast((BIT_DStream_t *)_llBits_1,temp_1._4_4_);
            pBStack_268 = pBStack_268 + sVar6;
          }
        }
      }
      if (llBase_1 < 2) {
        pBStack_268 = pBStack_268 + (int)(uint)(ofBase_1 == 0);
        if (pBStack_268 == (BYTE *)0x0) {
          pBStack_268 = *(BYTE **)((long)_llBits_1 + 0x58);
        }
        else {
          if (pBStack_268 == (BYTE *)0x3) {
            local_598 = *(long *)((long)_llBits_1 + 0x58) + -1;
          }
          else {
            local_598 = *(long *)((uint *)((long)_llBits_1 + 0x58) + (long)pBStack_268 * 2);
          }
          pos_1 = (int)(uint)((local_598 != 0 ^ 0xffU) & 1) + local_598;
          if (pBStack_268 != (BYTE *)0x1) {
            *(char **)((long)_llBits_1 + 0x68) = *(char **)((long)_llBits_1 + 0x60);
          }
          *(char **)((long)_llBits_1 + 0x60) = *(char **)((long)_llBits_1 + 0x58);
          pBStack_268 = (BYTE *)pos_1;
          *(size_t *)((long)_llBits_1 + 0x58) = pos_1;
        }
      }
      else {
        *(char **)((long)_llBits_1 + 0x68) = *(char **)((long)_llBits_1 + 0x60);
        *(char **)((long)_llBits_1 + 0x60) = *(char **)((long)_llBits_1 + 0x58);
        *(BYTE **)((long)_llBits_1 + 0x58) = pBStack_268;
      }
      pBVar2 = pBStack_268;
      uVar9 = (ulong)offset_1._4_4_;
      if (totalBits_1 == 0) {
        local_5a8 = 0;
      }
      else {
        local_5a8 = BIT_readBitsFast((BIT_DStream_t *)_llBits_1,totalBits_1);
      }
      uVar4 = MEM_32bits();
      if ((uVar4 != 0) && (0x13 < totalBits_1 + ofBits_1)) {
        BIT_reloadDStream((BIT_DStream_t *)_llBits_1);
      }
      uVar4 = MEM_64bits();
      if ((uVar4 != 0) && (0x1e < mlBase_1)) {
        BIT_reloadDStream((BIT_DStream_t *)_llBits_1);
      }
      uVar7 = (ulong)ofBase_1;
      if (ofBits_1 == 0) {
        local_5b8 = 0;
      }
      else {
        local_5b8 = BIT_readBitsFast((BIT_DStream_t *)_llBits_1,ofBits_1);
      }
      uVar4 = MEM_32bits();
      if (uVar4 != 0) {
        BIT_reloadDStream((BIT_DStream_t *)_llBits_1);
      }
      matchBase_1 = (BYTE *)(*(long *)((long)_llBits_1 + 0x80) + uVar7 + local_5b8);
      if (matchBase_1 < pBVar2) {
        local_5c0 = (char *)((BIT_DStream_t *)((long)_llBits_1 + 0x78))->bitContainer;
      }
      else {
        local_5c0 = *(char **)((long)_llBits_1 + 0x70);
      }
      local_288 = local_5c0;
      local_5c0 = local_5c0 + (long)matchBase_1;
      *(BYTE **)((long)_llBits_1 + 0x80) = matchBase_1 + uVar9 + local_5a8;
      pBVar10 = (BIT_DStream_t *)((long)_llBits_1 + 0x28);
      uVar1 = *(ulong *)(*(long *)((long)_llBits_1 + 0x30) + pBVar10->bitContainer * 8);
      bStack_95 = (byte)(uVar1 >> 0x18);
      sVar6 = BIT_readBits((BIT_DStream_t *)_llBits_1,(uint)bStack_95);
      pBVar10->bitContainer = (uVar1 & 0xffff) + sVar6;
      ppcVar11 = (char **)((long)_llBits_1 + 0x48);
      uVar1 = *(ulong *)(((BIT_DStream_t *)((long)_llBits_1 + 0x50))->bitContainer +
                        (long)*ppcVar11 * 8);
      bStack_bd = (byte)(uVar1 >> 0x18);
      sVar6 = BIT_readBits((BIT_DStream_t *)_llBits_1,(uint)bStack_bd);
      *ppcVar11 = (char *)((uVar1 & 0xffff) + sVar6);
      uVar4 = MEM_32bits();
      if (uVar4 != 0) {
        BIT_reloadDStream((BIT_DStream_t *)_llBits_1);
      }
      ppcVar11 = (char **)((long)_llBits_1 + 0x38);
      DInfo_5 = _llBits_1;
      uStack_e8._3_1_ =
           (byte)(*(ulong *)(*(char **)((long)_llBits_1 + 0x40) + (long)*ppcVar11 * 8) >> 0x18);
      lowBits_5._4_4_ = (uint)uStack_e8._3_1_;
      uStack_e8 = *(ulong *)(*(char **)((long)_llBits_1 + 0x40) + (long)*ppcVar11 * 8);
      local_f8 = BIT_readBits((BIT_DStream_t *)_llBits_1,lowBits_5._4_4_);
      *ppcVar11 = (char *)((uStack_e8 & 0xffff) + local_f8);
      lVar8 = (long)(int)(errcod._4_4_ - 4 & 3);
      local_238 = *(ulong *)(&stack0xfffffffffffffc18 + lVar8 * 0x20);
      local_230 = sequences[lVar8].litLength;
      local_228 = sequences[lVar8].matchLength;
      local_220 = (BYTE *)sequences[lVar8].offset;
      local_1a8 = litPtr;
      local_1b0 = op;
      local_1b8 = &litEnd;
      sequenceLength = (size_t)(litPtr + local_238);
      oMatchEnd = (BYTE *)(local_238 + local_230);
      oend_w = litPtr + (long)oMatchEnd;
      iLitEnd = op + -8;
      match = litEnd + local_238;
      length1 = (size_t)local_220;
      oLitEnd = dictEnd_00;
      local_1d0 = vBase;
      local_1c8 = base;
      local_1c0 = litLimit;
      if (op < oend_w) {
        local_1a0 = (BYTE *)0xffffffffffffffba;
      }
      else if (litLimit < match) {
        local_1a0 = (BYTE *)0xffffffffffffffec;
      }
      else if (iLitEnd < sequenceLength) {
        sequence_00.matchLength = local_230;
        sequence_00.litLength = local_238;
        sequence_00.offset = sequences[lVar8].matchLength;
        sequence_00.match = local_220;
        local_1a0 = (BYTE *)ZSTD_execSequenceLast7
                                      (litPtr,op,sequence_00,local_1b8,litLimit,base,vBase,
                                       dictEnd_00);
      }
      else {
        ZSTD_copy8(litPtr,litEnd);
        if (8 < local_238) {
          ZSTD_wildcopy(local_1a8 + 8,*local_1b8 + 8,local_238 - 8);
        }
        local_1a8 = (BYTE *)sequenceLength;
        *local_1b8 = match;
        if (sequenceLength - (long)local_1c8 < local_228) {
          if (sequenceLength - (long)local_1d0 < local_228) {
            local_1a0 = (BYTE *)0xffffffffffffffec;
          }
          else if (oLitEnd < (BYTE *)(length1 + local_230)) {
            _sub2 = (long)oLitEnd - length1;
            memmove((void *)sequenceLength,(void *)length1,_sub2);
            local_1a8 = (BYTE *)(sequenceLength + _sub2);
            local_230 = local_230 - _sub2;
            length1 = (size_t)local_1c8;
            if ((local_1a8 <= iLitEnd) && (2 < local_230)) goto LAB_00774da3;
            for (local_214 = 0; local_214 < local_230; local_214 = local_214 + 1) {
              local_1a8[local_214] = local_1c8[local_214];
            }
            local_1a0 = oMatchEnd;
          }
          else {
            memmove((void *)sequenceLength,(void *)length1,local_230);
            local_1a0 = oMatchEnd;
          }
        }
        else {
LAB_00774da3:
          if (local_228 < 8) {
            local_218 = *(int *)(ZSTD_execSequenceLong_dec64table + local_228 * 4);
            *local_1a8 = *(BYTE *)length1;
            local_1a8[1] = *(BYTE *)(length1 + 1);
            local_1a8[2] = *(BYTE *)(length1 + 2);
            local_1a8[3] = *(BYTE *)(length1 + 3);
            length1 = length1 + *(uint *)(ZSTD_execSequenceLong_dec32table + local_228 * 4);
            ZSTD_copy4(local_1a8 + 4,(void *)length1);
            length1 = length1 - (long)local_218;
          }
          else {
            ZSTD_copy8(local_1a8,(void *)length1);
          }
          local_1a8 = local_1a8 + 8;
          length1 = length1 + 8;
          if (local_1b0 + -0xd < oend_w) {
            if (local_1a8 < iLitEnd) {
              ZSTD_wildcopy(local_1a8,(void *)length1,(long)iLitEnd - (long)local_1a8);
              length1 = (size_t)(iLitEnd + (length1 - (long)local_1a8));
              local_1a8 = iLitEnd;
            }
            while (local_1a8 < oend_w) {
              *local_1a8 = *(BYTE *)length1;
              length1 = length1 + 1;
              local_1a8 = local_1a8 + 1;
            }
          }
          else {
            ZSTD_wildcopy(local_1a8,(void *)length1,local_230 - 8);
          }
          local_1a0 = oMatchEnd;
        }
      }
      pBVar3 = local_1a0;
      uVar4 = ERR_isError((size_t)local_1a0);
      if (uVar4 != 0) {
        return (size_t)pBVar3;
      }
      lVar8 = (long)(int)(errcod._4_4_ & 3);
      *(ulong *)(&stack0xfffffffffffffc18 + lVar8 * 0x20) = uVar7 + local_5b8;
      sequences[lVar8].litLength = uVar9 + local_5a8;
      sequences[lVar8].matchLength = (size_t)pBVar2;
      sequences[lVar8].offset = (long)local_5c0 - (long)pBVar2;
      litPtr = pBVar3 + (long)litPtr;
    }
    if ((int)errcod._4_4_ < ip._4_4_) {
      return 0xffffffffffffffec;
    }
    for (errcod._4_4_ = errcod._4_4_ - seqState.pos._4_4_; (int)errcod._4_4_ < ip._4_4_;
        errcod._4_4_ = errcod._4_4_ + 1) {
      lVar8 = (long)(int)(errcod._4_4_ & 3);
      local_198 = *(ulong *)(&stack0xfffffffffffffc18 + lVar8 * 0x20);
      local_190 = sequences[lVar8].litLength;
      local_188 = sequences[lVar8].matchLength;
      local_180 = (BYTE *)sequences[lVar8].offset;
      local_108 = litPtr;
      local_110 = op;
      local_118 = &litEnd;
      sequenceLength_1 = (size_t)(litPtr + local_198);
      oMatchEnd_1 = (BYTE *)(local_198 + local_190);
      oend_w_1 = litPtr + (long)oMatchEnd_1;
      iLitEnd_1 = op + -8;
      match_1 = litEnd + local_198;
      length1_1 = (size_t)local_180;
      oLitEnd_1 = dictEnd_00;
      local_130 = vBase;
      local_128 = base;
      local_120 = litLimit;
      if (op < oend_w_1) {
        local_100 = (BYTE *)0xffffffffffffffba;
      }
      else if (litLimit < match_1) {
        local_100 = (BYTE *)0xffffffffffffffec;
      }
      else if (iLitEnd_1 < sequenceLength_1) {
        sequence_01.matchLength = local_190;
        sequence_01.litLength = local_198;
        sequence_01.offset = sequences[lVar8].matchLength;
        sequence_01.match = local_180;
        local_100 = (BYTE *)ZSTD_execSequenceLast7
                                      (litPtr,op,sequence_01,local_118,litLimit,base,vBase,
                                       dictEnd_00);
      }
      else {
        ZSTD_copy8(litPtr,litEnd);
        if (8 < local_198) {
          ZSTD_wildcopy(local_108 + 8,*local_118 + 8,local_198 - 8);
        }
        local_108 = (BYTE *)sequenceLength_1;
        *local_118 = match_1;
        if (sequenceLength_1 - (long)local_128 < local_188) {
          if (sequenceLength_1 - (long)local_130 < local_188) {
            local_100 = (BYTE *)0xffffffffffffffec;
          }
          else if (oLitEnd_1 < (BYTE *)(length1_1 + local_190)) {
            _sub2_1 = (long)oLitEnd_1 - length1_1;
            memmove((void *)sequenceLength_1,(void *)length1_1,_sub2_1);
            local_108 = (BYTE *)(sequenceLength_1 + _sub2_1);
            local_190 = local_190 - _sub2_1;
            length1_1 = (size_t)local_128;
            if ((local_108 <= iLitEnd_1) && (2 < local_190)) goto LAB_00775455;
            for (local_174 = 0; local_174 < local_190; local_174 = local_174 + 1) {
              local_108[local_174] = local_128[local_174];
            }
            local_100 = oMatchEnd_1;
          }
          else {
            memmove((void *)sequenceLength_1,(void *)length1_1,local_190);
            local_100 = oMatchEnd_1;
          }
        }
        else {
LAB_00775455:
          if (local_188 < 8) {
            local_178 = *(int *)(ZSTD_execSequenceLong_dec64table + local_188 * 4);
            *local_108 = *(BYTE *)length1_1;
            local_108[1] = *(BYTE *)(length1_1 + 1);
            local_108[2] = *(BYTE *)(length1_1 + 2);
            local_108[3] = *(BYTE *)(length1_1 + 3);
            length1_1 = length1_1 + *(uint *)(ZSTD_execSequenceLong_dec32table + local_188 * 4);
            ZSTD_copy4(local_108 + 4,(void *)length1_1);
            length1_1 = length1_1 - (long)local_178;
          }
          else {
            ZSTD_copy8(local_108,(void *)length1_1);
          }
          local_108 = local_108 + 8;
          length1_1 = length1_1 + 8;
          if (local_110 + -0xd < oend_w_1) {
            if (local_108 < iLitEnd_1) {
              ZSTD_wildcopy(local_108,(void *)length1_1,(long)iLitEnd_1 - (long)local_108);
              length1_1 = (size_t)(iLitEnd_1 + (length1_1 - (long)local_108));
              local_108 = iLitEnd_1;
            }
            while (local_108 < oend_w_1) {
              *local_108 = *(BYTE *)length1_1;
              length1_1 = length1_1 + 1;
              local_108 = local_108 + 1;
            }
          }
          else {
            ZSTD_wildcopy(local_108,(void *)length1_1,local_190 - 8);
          }
          local_100 = oMatchEnd_1;
        }
      }
      pBVar2 = local_100;
      uVar4 = ERR_isError((size_t)local_100);
      if (uVar4 != 0) {
        return (size_t)pBVar2;
      }
      litPtr = pBVar2 + (long)litPtr;
    }
    for (lastLLSize._4_4_ = 0; lastLLSize._4_4_ < 3; lastLLSize._4_4_ = lastLLSize._4_4_ + 1) {
      (local_2e8->entropy).rep[lastLLSize._4_4_] =
           (U32)seqState.prevOffset[(ulong)lastLLSize._4_4_ - 1];
    }
  }
  uVar9 = (long)litLimit - (long)litEnd;
  if ((ulong)((long)op - (long)litPtr) < uVar9) {
    local_2e0 = (BYTE *)0xffffffffffffffba;
  }
  else {
    memcpy(litPtr,litEnd,uVar9);
    local_2e0 = litPtr + (uVar9 - (long)oend);
  }
  return (size_t)local_2e0;
}

Assistant:

static size_t
ZSTD_decompressSequencesLong_default(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset)
{
    return ZSTD_decompressSequencesLong_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}